

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runCCDPP_MPI.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Parameter parameter;
  CCDPP_MPI ccdpp;
  
  parameter.meta_path._M_dataplus._M_p = (pointer)&parameter.meta_path.field_2;
  parameter.meta_path._M_string_length = 0;
  parameter.meta_path.field_2._M_local_buf[0] = '\0';
  parameter.output_path._M_dataplus._M_p = (pointer)&parameter.output_path.field_2;
  parameter.output_path._M_string_length = 0;
  parameter.output_path.field_2._M_local_buf[0] = '\0';
  bVar1 = Parameter::create(&parameter,argc,argv);
  if (bVar1) {
    Parameter::print_parameters(&parameter);
    RandomUtil::init_seed();
    CCDPP_MPI::CCDPP_MPI(&ccdpp,&parameter);
    CCDPP_MPI::train(&ccdpp);
    CCDPP_MPI::predict_test_data(&ccdpp);
    if (parameter.output == true) {
      CCDPP_MPI::output(&ccdpp);
    }
    CCDPP_MPI::~CCDPP_MPI(&ccdpp);
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
  }
  Parameter::~Parameter(&parameter);
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
    Parameter parameter;
    if (!parameter.create(argc, argv)) {
        return 1;
    }

    parameter.print_parameters();
    RandomUtil::init_seed();

    CCDPP_MPI ccdpp(&parameter);
    ccdpp.train();
    ccdpp.predict_test_data();

    if (parameter.output) {
        ccdpp.output();
    }

    return 0;
}